

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::GeometryShaderTestInstance::createPipeline
          (GeometryShaderTestInstance *this)

{
  StencilOpState _front;
  StencilOpState _front_00;
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  RefData<vk::Handle<(vk::HandleType)14>_> data_01;
  RefData<vk::Handle<(vk::HandleType)16>_> data_02;
  RefData<vk::Handle<(vk::HandleType)18>_> data_03;
  StencilOpState _back;
  StencilOpState _back_00;
  DeviceInterface *deviceInterface;
  VkAllocationCallbacks *pVVar1;
  ProgramCollection<vk::ProgramBinary> *pPVar2;
  ProgramBinary *pPVar3;
  Handle<(vk::HandleType)16> *pHVar4;
  Handle<(vk::HandleType)17> *pHVar5;
  Handle<(vk::HandleType)14> *pHVar6;
  VkPhysicalDeviceFeatures *pVVar7;
  VkPipelineCache local_a28;
  Move<vk::Handle<(vk::HandleType)18>_> local_a20;
  RefData<vk::Handle<(vk::HandleType)18>_> local_a00;
  allocator<unsigned_int> local_9dd;
  value_type_conflict2 local_9dc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_9d8;
  MultiSampleState local_9c0;
  VkPipelineRasterizationStateCreateInfo local_978;
  VkStencilOpState local_938;
  VkStencilOpState local_918;
  VkPipelineDepthStencilStateCreateInfo local_8f8;
  VkStencilOpState local_890;
  VkStencilOpState local_870;
  VkPipelineDepthStencilStateCreateInfo local_850;
  allocator<vk::VkRect2D> local_7e1;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_7e0;
  allocator<vk::VkViewport> local_7c1;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_7c0;
  ViewportState local_7a8;
  undefined1 auStack_748 [8];
  VkRect2D scissor;
  VkViewport viewport;
  ColorBlendState local_718;
  VkPipelineInputAssemblyStateCreateInfo local_6c8;
  deUint64 local_6a8;
  VkPipelineShaderStageCreateInfo local_6a0;
  deUint64 local_670;
  VkPipelineShaderStageCreateInfo local_668;
  deUint64 local_638;
  VkPipelineShaderStageCreateInfo local_630;
  deUint64 local_600;
  VkPipelineLayout local_5f8;
  undefined1 local_5f0 [8];
  PipelineCreateInfo pipelineCreateInfo;
  VkPipelineVertexInputStateCreateInfo vf_info;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  VkVertexInputBindingDescription vertexInputBindingDescription;
  RefData<vk::Handle<(vk::HandleType)16>_> local_288;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_> local_268
  ;
  undefined1 local_248 [8];
  PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  Attachment attachmentState;
  Move<vk::Handle<(vk::HandleType)14>_> local_1a0;
  RefData<vk::Handle<(vk::HandleType)14>_> local_180;
  undefined1 local_160 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fs;
  string local_138;
  Move<vk::Handle<(vk::HandleType)14>_> local_118;
  RefData<vk::Handle<(vk::HandleType)14>_> local_f8;
  undefined1 local_d8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> gs;
  allocator<char> local_a1;
  string local_a0;
  Move<vk::Handle<(vk::HandleType)14>_> local_80;
  RefData<vk::Handle<(vk::HandleType)14>_> local_60;
  undefined1 local_40 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vs;
  VkDevice device;
  DeviceInterface *vk;
  GeometryShaderTestInstance *this_local;
  
  deviceInterface =
       Context::getDeviceInterface
                 ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                  super_TestInstance.m_context);
  pVVar1 = (VkAllocationCallbacks *)
           Context::getDevice((this->super_GraphicBasicTestInstance).
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator = pVVar1;
  pPVar2 = Context::getBinaryCollection
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"vertex",&local_a1);
  pPVar3 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_a0);
  ::vk::createShaderModule(&local_80,deviceInterface,(VkDevice)pVVar1,pPVar3,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_60,(Move *)&local_80);
  data.deleter.m_deviceIface._0_4_ = (int)local_60.deleter.m_deviceIface;
  data.object.m_internal = local_60.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_60.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_60.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_60.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_60.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_60.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_40,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pVVar1 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  pPVar2 = Context::getBinaryCollection
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"geometry",
             (allocator<char> *)
             ((long)&fs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator +
             7));
  pPVar3 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_138);
  ::vk::createShaderModule(&local_118,deviceInterface,(VkDevice)pVVar1,pPVar3,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_f8,(Move *)&local_118);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_f8.deleter.m_deviceIface;
  data_00.object.m_internal = local_f8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_f8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_f8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_f8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_f8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_f8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_d8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator +
             7));
  pVVar1 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  pPVar2 = Context::getBinaryCollection
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&attachmentState.super_VkPipelineColorBlendAttachmentState.colorWriteMask,
             "fragment",
             (allocator<char> *)
             ((long)&attachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp + 3));
  pPVar3 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (pPVar2,(string *)
                             &attachmentState.super_VkPipelineColorBlendAttachmentState.
                              colorWriteMask);
  ::vk::createShaderModule(&local_1a0,deviceInterface,(VkDevice)pVVar1,pPVar3,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_180,(Move *)&local_1a0);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_180.deleter.m_deviceIface;
  data_01.object.m_internal = local_180.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_180.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_180.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_180.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_180.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_180.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_160,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_1a0);
  std::__cxx11::string::~string
            ((string *)&attachmentState.super_VkPipelineColorBlendAttachmentState.colorWriteMask);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&attachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp + 3));
  Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            ((Attachment *)
             ((long)&pipelineLayoutCreateInfo.m_pushConstantRanges.
                     super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0,
             VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,
             VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf);
  local_268.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  vector(&local_268);
  Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
            ((PipelineLayoutCreateInfo *)local_248,&local_268,0,(VkPushConstantRange *)0x0);
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  ~vector(&local_268);
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&vertexInputBindingDescription.inputRate,
             deviceInterface,
             (VkDevice)vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator,
             (VkPipelineLayoutCreateInfo *)local_248,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_288,(Move *)&vertexInputBindingDescription.inputRate);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_288.deleter.m_deviceIface;
  data_02.object.m_internal = local_288.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_288.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_288.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_288.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_288.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_288.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::operator=
            (&(this->super_GraphicBasicTestInstance).m_pipelineLayout,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&vertexInputBindingDescription.inputRate);
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_UNDEFINED;
  vertexInputAttributeDescriptions[1].offset = 0x20;
  vertexInputBindingDescription.binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R4G4_UNORM_PACK8;
  vertexInputAttributeDescriptions[0].offset = 0;
  vertexInputAttributeDescriptions[1].location = 0x6d;
  vertexInputAttributeDescriptions[1].binding = 0x10;
  vf_info.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  vertexInputAttributeDescriptions[0].location = 0x6d;
  vertexInputAttributeDescriptions[0].binding = 0;
  pipelineCreateInfo.m_multisampleStateSampleMask.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x13;
  vf_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vf_info._4_4_ = 0;
  vf_info.pNext._0_4_ = 0;
  vf_info.pNext._4_4_ = 1;
  vf_info._16_8_ = &vertexInputAttributeDescriptions[1].format;
  vf_info.pVertexBindingDescriptions._0_4_ = 2;
  vf_info._32_8_ = &vf_info.pVertexAttributeDescriptions;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->super_GraphicBasicTestInstance).m_pipelineLayout.
                       super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  local_5f8.m_internal = pHVar4->m_internal;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->super_GraphicBasicTestInstance).m_renderPass.
                       super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_600 = pHVar5->m_internal;
  Draw::PipelineCreateInfo::PipelineCreateInfo
            ((PipelineCreateInfo *)local_5f0,local_5f8,(VkRenderPass)local_600,0,0);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_40);
  local_638 = pHVar6->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_630,(VkShaderModule)local_638,"main",
             VK_SHADER_STAGE_VERTEX_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_5f0,&local_630);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_d8);
  local_670 = pHVar6->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_668,(VkShaderModule)local_670,"main",
             VK_SHADER_STAGE_GEOMETRY_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_5f0,&local_668);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_160);
  local_6a8 = pHVar6->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_6a0,(VkShaderModule)local_6a8,"main",
             VK_SHADER_STAGE_FRAGMENT_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_5f0,&local_6a0);
  Draw::PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)&local_6c8,
             ((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology,0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_5f0,&local_6c8);
  Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
            (&local_718,1,
             (VkPipelineColorBlendAttachmentState *)
             ((long)&pipelineLayoutCreateInfo.m_pushConstantRanges.
                     super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0,VK_LOGIC_OP_COPY);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_5f0,&local_718.super_VkPipelineColorBlendStateCreateInfo);
  Draw::PipelineCreateInfo::ColorBlendState::~ColorBlendState(&local_718);
  scissor.extent.width = 0;
  scissor.extent.height = 0;
  auStack_748._0_4_ = 0;
  auStack_748._4_4_ = 0;
  scissor.offset.x = 0x40;
  scissor.offset.y = 0x40;
  std::allocator<vk::VkViewport>::allocator(&local_7c1);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector
            (&local_7c0,1,(value_type *)&scissor.extent,&local_7c1);
  std::allocator<vk::VkRect2D>::allocator(&local_7e1);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::vector
            (&local_7e0,1,(value_type *)auStack_748,&local_7e1);
  Draw::PipelineCreateInfo::ViewportState::ViewportState(&local_7a8,1,&local_7c0,&local_7e0);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_5f0,&local_7a8.super_VkPipelineViewportStateCreateInfo);
  Draw::PipelineCreateInfo::ViewportState::~ViewportState(&local_7a8);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~vector(&local_7e0);
  std::allocator<vk::VkRect2D>::~allocator(&local_7e1);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~vector(&local_7c0);
  std::allocator<vk::VkViewport>::~allocator(&local_7c1);
  pVVar7 = Context::getDeviceFeatures
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  if (pVVar7->depthBounds == 0) {
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_918,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_938,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    _front_00.super_VkStencilOpState.depthFailOp = local_918.depthFailOp;
    _front_00.super_VkStencilOpState.failOp = local_918.failOp;
    _front_00.super_VkStencilOpState.passOp = local_918.passOp;
    _front_00.super_VkStencilOpState.compareOp = local_918.compareOp;
    _front_00.super_VkStencilOpState.compareMask = local_918.compareMask;
    _front_00.super_VkStencilOpState.writeMask = local_918.writeMask;
    _front_00.super_VkStencilOpState.reference = local_918.reference;
    _back_00.super_VkStencilOpState.depthFailOp = local_938.depthFailOp;
    _back_00.super_VkStencilOpState.failOp = local_938.failOp;
    _back_00.super_VkStencilOpState.passOp = local_938.passOp;
    _back_00.super_VkStencilOpState.compareOp = local_938.compareOp;
    _back_00.super_VkStencilOpState.compareMask = local_938.compareMask;
    _back_00.super_VkStencilOpState.writeMask = local_938.writeMask;
    _back_00.super_VkStencilOpState.reference = local_938.reference;
    Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
              ((DepthStencilState *)&local_8f8,0,0,VK_COMPARE_OP_ALWAYS,0,0,_front_00,_back_00,0.0,
               1.0);
    Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_5f0,&local_8f8);
  }
  else {
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_870,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_890,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    _front.super_VkStencilOpState.depthFailOp = local_870.depthFailOp;
    _front.super_VkStencilOpState.failOp = local_870.failOp;
    _front.super_VkStencilOpState.passOp = local_870.passOp;
    _front.super_VkStencilOpState.compareOp = local_870.compareOp;
    _front.super_VkStencilOpState.compareMask = local_870.compareMask;
    _front.super_VkStencilOpState.writeMask = local_870.writeMask;
    _front.super_VkStencilOpState.reference = local_870.reference;
    _back.super_VkStencilOpState.depthFailOp = local_890.depthFailOp;
    _back.super_VkStencilOpState.failOp = local_890.failOp;
    _back.super_VkStencilOpState.passOp = local_890.passOp;
    _back.super_VkStencilOpState.compareOp = local_890.compareOp;
    _back.super_VkStencilOpState.compareMask = local_890.compareMask;
    _back.super_VkStencilOpState.writeMask = local_890.writeMask;
    _back.super_VkStencilOpState.reference = local_890.reference;
    Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
              ((DepthStencilState *)&local_850,1,1,VK_COMPARE_OP_GREATER_OR_EQUAL,1,0,_front,_back,
               0.0,1.0);
    Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_5f0,&local_850);
  }
  Draw::PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)&local_978,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_5f0,&local_978);
  local_9dc = 0xffffffff;
  std::allocator<unsigned_int>::allocator(&local_9dd);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_9d8,1,&local_9dc,&local_9dd);
  Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
            (&local_9c0,VK_SAMPLE_COUNT_1_BIT,0,0.0,&local_9d8,false,false);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_5f0,&local_9c0.super_VkPipelineMultisampleStateCreateInfo);
  Draw::PipelineCreateInfo::MultiSampleState::~MultiSampleState(&local_9c0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_9d8);
  std::allocator<unsigned_int>::~allocator(&local_9dd);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_5f0,
             (VkPipelineVertexInputStateCreateInfo *)
             &pipelineCreateInfo.m_multisampleStateSampleMask.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pVVar1 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_a28,0);
  ::vk::createGraphicsPipeline
            (&local_a20,deviceInterface,(VkDevice)pVVar1,local_a28,
             (VkGraphicsPipelineCreateInfo *)local_5f0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a00,(Move *)&local_a20);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_a00.deleter.m_deviceIface;
  data_03.object.m_internal = local_a00.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_a00.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_a00.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_a00.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_a00.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_a00.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=
            (&(this->super_GraphicBasicTestInstance).m_pipeline,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_a20);
  Draw::PipelineCreateInfo::~PipelineCreateInfo((PipelineCreateInfo *)local_5f0);
  Draw::PipelineLayoutCreateInfo::~PipelineLayoutCreateInfo((PipelineLayoutCreateInfo *)local_248);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_160);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_40);
  return;
}

Assistant:

void GeometryShaderTestInstance::createPipeline (void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	// Pipeline
	Unique<VkShaderModule> vs(createShaderModule(vk, device, m_context.getBinaryCollection().get("vertex"), (VkShaderModuleCreateFlags)0));
	Unique<VkShaderModule> gs(createShaderModule(vk, device, m_context.getBinaryCollection().get("geometry"), (VkShaderModuleCreateFlags)0));
	Unique<VkShaderModule> fs(createShaderModule(vk, device, m_context.getBinaryCollection().get("fragment"), (VkShaderModuleCreateFlags)0));

	const PipelineCreateInfo::ColorBlendState::Attachment attachmentState;

	const PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
	m_pipelineLayout = createPipelineLayout(vk, device, &pipelineLayoutCreateInfo);

	const VkVertexInputBindingDescription vertexInputBindingDescription		=
	{
		0u,											// binding;
		static_cast<deUint32>(sizeof(VertexData)),	// stride;
		VK_VERTEX_INPUT_RATE_VERTEX					// inputRate
	};

	const VkVertexInputAttributeDescription vertexInputAttributeDescriptions[] =
	{
		{
			0u,
			0u,
			VK_FORMAT_R32G32B32A32_SFLOAT,
			0u
		},	// VertexElementData::position
		{
			1u,
			0u,
			VK_FORMAT_R32G32B32A32_SFLOAT,
			static_cast<deUint32>(sizeof(tcu::Vec4))
		},	// VertexElementData::color
	};

	const VkPipelineVertexInputStateCreateInfo vf_info			=
	{																	// sType;
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// pNext;
		NULL,															// flags;
		0u,																// vertexBindingDescriptionCount;
		1,																// pVertexBindingDescriptions;
		&vertexInputBindingDescription,									// vertexAttributeDescriptionCount;
		2,																// pVertexAttributeDescriptions;
		vertexInputAttributeDescriptions
	};

	PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, (VkPipelineCreateFlags)0);
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", VK_SHADER_STAGE_VERTEX_BIT));
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*gs, "main", VK_SHADER_STAGE_GEOMETRY_BIT));
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", VK_SHADER_STAGE_FRAGMENT_BIT));
	pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(m_parametersGraphic.primitiveTopology));
	pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &attachmentState));

	const VkViewport	viewport	=
	{
		0.0f,		// float x;
		0.0f,		// float y;
		WIDTH,	// float width;
		HEIGHT,	// float height;
		0.0f,	// float minDepth;
		1.0f	// float maxDepth;
	};

	const VkRect2D		scissor		=
	{
		{
			0,		// deInt32 x
			0,		// deInt32 y
		},		// VkOffset2D	offset;
		{
			WIDTH,	// deInt32 width;
			HEIGHT,	// deInt32 height
		},		// VkExtent2D	extent;
	};
	pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1, std::vector<VkViewport>(1, viewport), std::vector<VkRect2D>(1, scissor)));

	if (m_context.getDeviceFeatures().depthBounds)
		pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState(true, true, VK_COMPARE_OP_GREATER_OR_EQUAL, true));
	else
		pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState());

	pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState(false));
	pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());
	pipelineCreateInfo.addState(vf_info);
	m_pipeline = createGraphicsPipeline(vk, device, DE_NULL, &pipelineCreateInfo);
}